

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O3

int ecp_mod_koblitz(mbedtls_mpi *N,mbedtls_mpi_uint *Rp,size_t p_limbs,size_t adjust,size_t shift,
                   mbedtls_mpi_uint mask)

{
  mbedtls_mpi_uint *pmVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  mbedtls_mpi R;
  mbedtls_mpi_uint Mp [5];
  mbedtls_mpi local_a8;
  mbedtls_mpi_uint local_90;
  size_t local_88;
  long local_80;
  ulong local_78;
  mbedtls_mpi local_70;
  mbedtls_mpi_uint local_58 [5];
  
  iVar2 = 0;
  if (p_limbs <= N->n) {
    local_70.s = 1;
    local_70.n = 1;
    local_a8.s = 1;
    local_a8.p = local_58;
    uVar4 = N->n - (p_limbs - adjust);
    local_78 = adjust + p_limbs;
    if (local_78 <= uVar4) {
      uVar4 = local_78;
    }
    local_58[0] = 0;
    local_58[1] = 0;
    local_58[2] = 0;
    local_58[3] = 0;
    local_58[4] = 0;
    local_80 = p_limbs * 8;
    local_a8.n = uVar4;
    local_90 = mask;
    local_88 = shift;
    local_70.p = Rp;
    memcpy(local_a8.p,N->p + (p_limbs - adjust),uVar4 * 8);
    if ((local_88 == 0) ||
       (iVar2 = mbedtls_mpi_shift_r(&local_a8,local_88), uVar4 = local_a8.n, iVar2 == 0)) {
      local_a8.n = (uVar4 - adjust) + 1;
      if (local_90 != 0) {
        N->p[p_limbs - 1] = N->p[p_limbs - 1] & local_90;
      }
      if (p_limbs < N->n) {
        pmVar1 = N->p;
        sVar3 = p_limbs;
        do {
          pmVar1[sVar3] = 0;
          sVar3 = sVar3 + 1;
        } while (sVar3 < N->n);
      }
      iVar2 = mbedtls_mpi_mul_mpi(&local_a8,&local_a8,&local_70);
      if ((iVar2 == 0) && (iVar2 = mbedtls_mpi_add_abs(N,N,&local_a8), iVar2 == 0)) {
        uVar4 = N->n - (p_limbs - adjust);
        if (local_78 <= uVar4) {
          uVar4 = local_78;
        }
        local_58[0] = 0;
        local_58[1] = 0;
        local_58[2] = 0;
        local_58[3] = 0;
        local_58[4] = 0;
        local_a8.n = uVar4;
        memcpy(local_58,(void *)((long)N->p + adjust * -8 + local_80),uVar4 * 8);
        if ((local_88 == 0) ||
           (iVar2 = mbedtls_mpi_shift_r(&local_a8,local_88), uVar4 = local_a8.n, iVar2 == 0)) {
          local_a8.n = (local_70.n - adjust) + uVar4;
          if (local_90 != 0) {
            N->p[p_limbs - 1] = N->p[p_limbs - 1] & local_90;
          }
          if (p_limbs < N->n) {
            pmVar1 = N->p;
            do {
              pmVar1[p_limbs] = 0;
              p_limbs = p_limbs + 1;
            } while (p_limbs < N->n);
          }
          iVar2 = mbedtls_mpi_mul_mpi(&local_a8,&local_a8,&local_70);
          if (iVar2 == 0) {
            iVar2 = mbedtls_mpi_add_abs(N,N,&local_a8);
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static inline int ecp_mod_koblitz( mbedtls_mpi *N, mbedtls_mpi_uint *Rp, size_t p_limbs,
                                   size_t adjust, size_t shift, mbedtls_mpi_uint mask )
{
    int ret;
    size_t i;
    mbedtls_mpi M, R;
    mbedtls_mpi_uint Mp[P_KOBLITZ_MAX + P_KOBLITZ_R];

    if( N->n < p_limbs )
        return( 0 );

    /* Init R */
    R.s = 1;
    R.p = Rp;
    R.n = P_KOBLITZ_R;

    /* Common setup for M */
    M.s = 1;
    M.p = Mp;

    /* M = A1 */
    M.n = N->n - ( p_limbs - adjust );
    if( M.n > p_limbs + adjust )
        M.n = p_limbs + adjust;
    memset( Mp, 0, sizeof Mp );
    memcpy( Mp, N->p + p_limbs - adjust, M.n * sizeof( mbedtls_mpi_uint ) );
    if( shift != 0 )
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &M, shift ) );
    M.n += R.n - adjust; /* Make room for multiplication by R */

    /* N = A0 */
    if( mask != 0 )
        N->p[p_limbs - 1] &= mask;
    for( i = p_limbs; i < N->n; i++ )
        N->p[i] = 0;

    /* N = A0 + R * A1 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &M, &M, &R ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_abs( N, N, &M ) );

    /* Second pass */

    /* M = A1 */
    M.n = N->n - ( p_limbs - adjust );
    if( M.n > p_limbs + adjust )
        M.n = p_limbs + adjust;
    memset( Mp, 0, sizeof Mp );
    memcpy( Mp, N->p + p_limbs - adjust, M.n * sizeof( mbedtls_mpi_uint ) );
    if( shift != 0 )
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &M, shift ) );
    M.n += R.n - adjust; /* Make room for multiplication by R */

    /* N = A0 */
    if( mask != 0 )
        N->p[p_limbs - 1] &= mask;
    for( i = p_limbs; i < N->n; i++ )
        N->p[i] = 0;

    /* N = A0 + R * A1 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &M, &M, &R ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_abs( N, N, &M ) );

cleanup:
    return( ret );
}